

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BVSparseNode * __thiscall
BVSparse<Memory::HeapAllocator>::DeleteNode
          (BVSparse<Memory::HeapAllocator> *this,BVSparseNode *node,bool bResetLastUsed)

{
  BVSparseNode *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000011;
  
  this->lastFoundIndex = (Type_conflict)0x0;
  pBVar1 = node->next;
  Memory::HeapAllocator::Free(this->alloc,node,0x18);
  if ((int)CONCAT71(in_register_00000011,bResetLastUsed) == 0) {
    if ((BVSparseNode *)this->lastUsedNodePrevNextField == node) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
                         ,0x209,"(this->lastUsedNodePrevNextField != &node->next)",
                         "this->lastUsedNodePrevNextField != &node->next");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    this->lastUsedNodePrevNextField = &this->head;
  }
  return pBVar1;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::DeleteNode(BVSparseNode *node, bool bResetLastUsed)
{
    this->lastFoundIndex = nullptr;
    BVSparseNode *next = node->next;
    QueueInFreeList(node);

    if (bResetLastUsed)
    {
        this->lastUsedNodePrevNextField = &this->head;
    }
    else
    {
        Assert(this->lastUsedNodePrevNextField != &node->next);
    }
    return next;
}